

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O1

int __thiscall
TFileNameDatabase::CreateDatabase(TFileNameDatabase *this,LPBYTE pbMarData,size_t cbMarData)

{
  int iVar1;
  TByteStream ByteStream;
  TByteStream local_38;
  
  local_38.field_C = 0;
  local_38.pvMappedFile._0_4_ = 0;
  local_38.pvMappedFile._4_4_ = 0;
  local_38.hFile = (HANDLE)0x0;
  local_38.hMap = (HANDLE)0x0;
  iVar1 = 0x16;
  if ((pbMarData != (LPBYTE)0x0 || cbMarData == 0) &&
     (iVar1 = 0x16, cbMarData == 0 || pbMarData != (LPBYTE)0x0)) {
    if (cbMarData < 4) {
      iVar1 = 1000;
      local_38.pbByteData = pbMarData;
    }
    else {
      local_38.pbByteData = pbMarData + 4;
      cbMarData = cbMarData - 4;
      pbMarData = (LPBYTE)(ulong)(*(int *)pbMarData != 0x52414d);
      iVar1 = 0;
    }
    if ((iVar1 == 0) && (iVar1 = 1000, ((ulong)pbMarData & 1) == 0)) {
      local_38.cbByteData = cbMarData;
      iVar1 = LoadFromStream(this,&local_38);
    }
  }
  return iVar1;
}

Assistant:

int CreateDatabase(LPBYTE pbMarData, size_t cbMarData)
    {
        TByteStream ByteStream;
        DWORD dwSignature;
        int nError;

        if(pbMarData == NULL && cbMarData != 0)
            return ERROR_INVALID_PARAMETER;

        nError = ByteStream.SetByteBuffer(pbMarData, cbMarData);
        if(nError == ERROR_SUCCESS)
        {
            // Get pointer to MAR signature
            nError = ByteStream.GetValue<DWORD>(dwSignature);
            if(nError != ERROR_SUCCESS)
                return nError;

            // Verify the signature
            if(dwSignature != MNDX_MAR_SIGNATURE)
                return ERROR_BAD_FORMAT;

            // HOTS: 1956E11
            nError = LoadFromStream(ByteStream);
        }

        return nError;
    }